

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ForkBranch<kj::Own<CallResultHolder>_>::get
          (ForkBranch<kj::Own<CallResultHolder>_> *this,ExceptionOrValue *output)

{
  uint *puVar1;
  NullableValue<kj::Exception> *other;
  Refcounted *refcounted;
  Own<CallResultHolder> local_38;
  Own<CallResultHolder> local_28;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  local_38.disposer = (Disposer *)other[1].field_1.value.ownFile.content.ptr;
  if ((CallResultHolder *)local_38.disposer == (CallResultHolder *)0x0) {
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (CallResultHolder *)0x0;
    Own<CallResultHolder>::operator=((Own<CallResultHolder> *)(output + 1),&local_38);
    Own<CallResultHolder>::dispose(&local_38);
  }
  else {
    puVar1 = &(((CallResultHolder *)local_38.disposer)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_28.ptr = (CallResultHolder *)0x0;
    local_38.ptr = (CallResultHolder *)local_38.disposer;
    local_28.disposer = local_38.disposer;
    Own<CallResultHolder>::operator=((Own<CallResultHolder> *)(output + 1),&local_38);
    Own<CallResultHolder>::dispose(&local_38);
    Own<CallResultHolder>::dispose(&local_28);
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }